

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.cpp
# Opt level: O2

TestResult * __thiscall JsonTest::TestResult::operator<<(TestResult *this,Int64 value)

{
  LargestInt in_RDX;
  string local_30;
  
  Json::valueToString_abi_cxx11_(&local_30,(Json *)value,in_RDX);
  addToLastFailure(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

TestResult& TestResult::operator<<(Json::Int64 value) {
  return addToLastFailure(Json::valueToString(value));
}